

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ThreadLocal2 *this_00;
  iterator __position;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  int *piVar9;
  size_t sVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  range<unsigned_int> *current_00;
  ulong uVar14;
  ulong uVar15;
  range<unsigned_int> rVar16;
  uint uVar17;
  ulong uVar18;
  range<unsigned_int> rVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar27;
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  MutexSys *local_270;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_268;
  ThreadLocal2 *local_250;
  undefined1 local_248 [16];
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_228;
  range<unsigned_int> local_1f8 [8];
  MutexSys *local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  MutexSys local_1a8;
  int iStack_19c;
  undefined8 local_198 [45];
  
  local_268._8_8_ = local_268._0_8_;
  this_01 = alloc.alloc;
  pTVar6 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar11 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar11 + 1) = 1;
    puVar11[2] = puVar11 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 2),local_1b8,
               (long)&local_1b8->mutex + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar11,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar21 = (this->super_Settings).maxLeafSize;
  local_230 = __return_storage_ptr__;
  if (uVar21 < current->_end - current->_begin) {
    local_248._8_8_ = local_248._0_8_;
    local_248._0_8_ = depth;
    local_1f8[0] = *current;
    uVar12 = (this->super_Settings).branchingFactor;
    uVar23 = 1;
    do {
      if (uVar23 == 0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar14 = 0;
        uVar18 = 0;
        uVar15 = 0xffffffffffffffff;
        do {
          uVar20 = (ulong)(local_1f8[uVar14]._end - local_1f8[uVar14]._begin);
          uVar13 = uVar14;
          if (uVar20 <= uVar21 || uVar20 <= uVar18) {
            uVar13 = uVar15;
            uVar20 = uVar18;
          }
          uVar18 = uVar20;
          uVar14 = uVar14 + 1;
          uVar15 = uVar13;
        } while (uVar23 != uVar14);
      }
      if (uVar13 == 0xffffffffffffffff) break;
      uVar17 = local_1f8[uVar13]._end + local_1f8[uVar13]._begin >> 1;
      rVar16._end = local_1f8[uVar13]._end;
      rVar16._begin = uVar17;
      rVar19._end = uVar17;
      rVar19._begin = local_1f8[uVar13]._begin;
      local_1f8[uVar13] = local_1f8[uVar23 - 1];
      local_1f8[uVar23 - 1] = rVar19;
      local_1f8[uVar23] = rVar16;
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar12);
    local_270 = (MutexSys *)0x80;
    this_00 = (alloc.talloc0)->parent;
    if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
      local_228._8_1_ = '\x01';
      local_228.ref.ptr = (size_t)this_00;
      MutexSys::lock(&this_00->mutex);
      if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((this_00->alloc0).end + (this_00->alloc1).end) -
             ((this_00->alloc0).cur + (this_00->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
        UNLOCK();
      }
      (this_00->alloc0).bytesUsed = 0;
      (this_00->alloc0).bytesWasted = 0;
      (this_00->alloc0).end = 0;
      (this_00->alloc0).allocBlockSize = 0;
      (this_00->alloc0).ptr = (char *)0x0;
      (this_00->alloc0).cur = 0;
      if (this_01 == (FastAllocator *)0x0) {
        (this_00->alloc1).bytesUsed = 0;
        (this_00->alloc1).bytesWasted = 0;
        (this_00->alloc1).end = 0;
        (this_00->alloc1).allocBlockSize = 0;
        (this_00->alloc1).ptr = (char *)0x0;
        (this_00->alloc1).cur = 0;
      }
      else {
        (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
        (this_00->alloc1).ptr = (char *)0x0;
        (this_00->alloc1).cur = 0;
        (this_00->alloc1).end = 0;
        (this_00->alloc1).allocBlockSize = 0;
        (this_00->alloc1).bytesUsed = 0;
        (this_00->alloc1).bytesWasted = 0;
        (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
      }
      LOCK();
      (this_00->alloc)._M_b._M_p = this_01;
      UNLOCK();
      local_1b8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      local_1b0 = '\x01';
      local_250 = this_00;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      __position._M_current =
           (this_01->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_01->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&this_01->thread_local_allocators,__position,&local_250);
      }
      else {
        *__position._M_current = local_250;
        pppTVar2 = &(this_01->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (local_1b0 == '\x01') {
        MutexSys::unlock(local_1b8);
      }
      if (local_228._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_228.ref.ptr);
      }
    }
    pTVar6->bytesUsed = (long)&local_270->mutex + pTVar6->bytesUsed;
    sVar10 = pTVar6->cur;
    uVar21 = (ulong)(-(int)sVar10 & 0xf);
    uVar12 = (long)&local_270->mutex + uVar21 + sVar10;
    pTVar6->cur = uVar12;
    if (pTVar6->end < uVar12) {
      pTVar6->cur = sVar10;
      if ((MutexSys *)pTVar6->allocBlockSize < (MutexSys *)((long)local_270 << 2)) {
        pcVar22 = (char *)FastAllocator::malloc(this_01,(size_t)&local_270);
      }
      else {
        local_1b8 = (MutexSys *)pTVar6->allocBlockSize;
        pcVar22 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar6->ptr = pcVar22;
        sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar10;
        pTVar6->cur = 0;
        pTVar6->end = (size_t)local_1b8;
        pTVar6->cur = (size_t)local_270;
        if (local_1b8 < local_270) {
          pTVar6->cur = 0;
          local_1b8 = (MutexSys *)pTVar6->allocBlockSize;
          local_268._0_8_ = this;
          pcVar22 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
          pTVar6->ptr = pcVar22;
          sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
          pTVar6->bytesWasted = sVar10;
          pTVar6->cur = 0;
          pTVar6->end = (size_t)local_1b8;
          pTVar6->cur = (size_t)local_270;
          this = (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                  *)local_268._0_8_;
          if (local_1b8 < local_270) {
            pTVar6->cur = 0;
            pcVar22 = (char *)0x0;
          }
          else {
            pTVar6->bytesWasted = sVar10;
          }
        }
        else {
          pTVar6->bytesWasted = sVar10;
        }
      }
    }
    else {
      pTVar6->bytesWasted = pTVar6->bytesWasted + uVar21;
      pcVar22 = pTVar6->ptr + (uVar12 - (long)local_270);
    }
    auVar25 = _DAT_01feb9f0;
    *(undefined1 (*) [16])(pcVar22 + 0x60) = _DAT_01feb9f0;
    *(undefined1 (*) [16])(pcVar22 + 0x40) = auVar25;
    *(undefined1 (*) [16])(pcVar22 + 0x20) = auVar25;
    aVar27 = _DAT_01feba00;
    *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar22 + 0x70) = _DAT_01feba00;
    *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar22 + 0x50) = aVar27;
    *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar22 + 0x30) = aVar27;
    lVar7 = 0;
    do {
      pcVar3 = pcVar22 + lVar7 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      lVar7 = lVar7 + 2;
    } while (lVar7 != 4);
    if (uVar23 != 0) {
      local_248._0_8_ = local_248._0_8_ + 1;
      current_00 = local_1f8;
      puVar11 = local_198;
      local_268._0_8_ = this;
      uVar21 = uVar23;
      do {
        alloc_00.talloc0 = alloc.talloc0;
        alloc_00.alloc = alloc.alloc;
        alloc_00.talloc1 = alloc.talloc1;
        createLargeLeaf(&local_228,
                        (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                         *)local_268._0_8_,local_248._0_8_,current_00,alloc_00);
        puVar11[-4] = local_228.ref.ptr;
        puVar11[-2] = local_228.bounds.lower.field_0._0_8_;
        puVar11[-1] = local_228.bounds.lower.field_0._8_8_;
        *puVar11 = local_228.bounds.upper.field_0._0_8_;
        puVar11[1] = local_228.bounds.upper.field_0._8_8_;
        puVar11 = puVar11 + 6;
        current_00 = current_00 + 1;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      pauVar8 = (undefined1 (*) [16])local_198;
      uVar21 = 0;
      auVar25 = _DAT_01feb9f0;
      aVar27 = _DAT_01feba00;
      do {
        auVar4 = pauVar8[-1];
        auVar5 = *pauVar8;
        auVar25 = minps(auVar25,auVar4);
        aVar27.m128 = (__m128)maxps(aVar27.m128,auVar5);
        *(undefined8 *)(pcVar22 + uVar21 * 8) = *(undefined8 *)pauVar8[-2];
        *(int *)(pcVar22 + uVar21 * 4 + 0x20) = auVar4._0_4_;
        *(int *)(pcVar22 + uVar21 * 4 + 0x40) = auVar4._4_4_;
        *(int *)(pcVar22 + uVar21 * 4 + 0x60) = auVar4._8_4_;
        *(int *)(pcVar22 + uVar21 * 4 + 0x30) = auVar5._0_4_;
        *(int *)(pcVar22 + uVar21 * 4 + 0x50) = auVar5._4_4_;
        *(int *)(pcVar22 + uVar21 * 4 + 0x70) = auVar5._8_4_;
        uVar21 = uVar21 + 1;
        pauVar8 = pauVar8 + 3;
      } while (uVar23 != uVar21);
    }
    auVar24 = auVar25._0_12_;
    if (uVar23 == 0) {
      uVar21 = 0;
    }
    else {
      piVar9 = &iStack_19c;
      uVar21 = 0;
      uVar12 = uVar23;
      do {
        uVar21 = uVar21 + (long)*piVar9;
        piVar9 = piVar9 + 0xc;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    if ((0xfff < uVar21) && (uVar23 != 0)) {
      piVar9 = &iStack_19c;
      uVar12 = 0;
      local_268 = aVar27;
      local_248 = auVar25;
      do {
        if (*piVar9 < 0x1000) {
          BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar22 + uVar12 * 8),1);
          pcVar22[uVar12 * 8 + 7] = pcVar22[uVar12 * 8 + 7] | 0x80;
          auVar25 = local_248;
          aVar27 = local_268;
        }
        auVar24 = auVar25._0_12_;
        uVar12 = uVar12 + 1;
        piVar9 = piVar9 + 0xc;
      } while (uVar23 != uVar12);
    }
    aVar26.m128[3] = (float)(int)uVar21;
    aVar26._0_12_ = auVar24;
    (local_230->ref).ptr = (size_t)pcVar22;
    (local_230->bounds).lower.field_0 = aVar26;
    (local_230->bounds).upper.field_0 = aVar27;
  }
  else {
    CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
  }
  return local_230;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }